

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vstat.cc
# Opt level: O1

void anon_unknown.dwarf_393d::PrintUsage(ostream *stream)

{
  long lVar1;
  char cVar2;
  ostream *poVar3;
  char *pcVar4;
  size_t sVar5;
  
  cVar2 = (char)stream;
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream," vstat - vector statistics calculation",0x26);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  usage:",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       vstat [ options ] [ infile ] > stdout",0x2c);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  options:",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -l l  : length of vector     (   int)[",0x2d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)stream,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][ 1 <= l <=     ]",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -m m  : order of vector      (   int)[",0x2d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"l-1",3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"][ 0 <= m <=     ]",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -t t  : output interval      (   int)[",0x2d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"EOF",3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"][ 1 <= t <=     ]",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -c c  : confidence level     (double)[",0x2d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar3 = std::ostream::_M_insert<double>(95.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][ 0 <  c <  100 ]",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -o o  : output format        (   int)[",0x2d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)stream,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"][ 0 <= o <= 7   ]",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"                 0 (mean and covariance)",0x28);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 1 (mean)",0x19);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 2 (covariance)",0x1f);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"                 3 (standard deviation)",0x27);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 4 (correlation)",0x20)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"                 5 (precision)",0x1e);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"                 6 (mean and lower/upper bounds)",0x30);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"                 7 (sufficient statistics)",0x2a);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -s s  : statistics file      (string)[",0x2d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"N/A",3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -d    : output only diagonal (  bool)[",0x2d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  pcVar4 = sptk::ConvertBooleanToString(false);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"               elements",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -e    : use a numerically    (  bool)[",0x2d);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x80;
  pcVar4 = sptk::ConvertBooleanToString(false);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"               stable algorithm",0x1f);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -h    : print this message",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  infile:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       vectors                      (double)[stdin]",0x33);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  stdout:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       statistics                   (double)",0x2c);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  notice:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -d is valid only if o = 0, 2 or 7",0x28);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"       -s can be specified multiple times",0x29);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream," SPTK: version ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"4.3",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " vstat - vector statistics calculation" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       vstat [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -l l  : length of vector     (   int)[" << std::setw(5) << std::right << kDefaultVectorLength    << "][ 1 <= l <=     ]" << std::endl;  // NOLINT
  *stream << "       -m m  : order of vector      (   int)[" << std::setw(5) << std::right << "l-1"                   << "][ 0 <= m <=     ]" << std::endl;  // NOLINT
  *stream << "       -t t  : output interval      (   int)[" << std::setw(5) << std::right << "EOF"                   << "][ 1 <= t <=     ]" << std::endl;  // NOLINT
  *stream << "       -c c  : confidence level     (double)[" << std::setw(5) << std::right << kDefaultConfidenceLevel << "][ 0 <  c <  100 ]" << std::endl;  // NOLINT
  *stream << "       -o o  : output format        (   int)[" << std::setw(5) << std::right << kDefaultOutputFormat    << "][ 0 <= o <= 7   ]" << std::endl;  // NOLINT
  *stream << "                 0 (mean and covariance)" << std::endl;
  *stream << "                 1 (mean)" << std::endl;
  *stream << "                 2 (covariance)" << std::endl;
  *stream << "                 3 (standard deviation)" << std::endl;
  *stream << "                 4 (correlation)" << std::endl;
  *stream << "                 5 (precision)" << std::endl;
  *stream << "                 6 (mean and lower/upper bounds)" << std::endl;
  *stream << "                 7 (sufficient statistics)" << std::endl;
  *stream << "       -s s  : statistics file      (string)[" << std::setw(5) << std::right << "N/A"                   << "]" << std::endl;  // NOLINT
  *stream << "       -d    : output only diagonal (  bool)[" << std::setw(5) << std::right << sptk::ConvertBooleanToString(kDefaultOutputOnlyDiagonalElementsFlag) << "]" << std::endl;  // NOLINT
  *stream << "               elements" << std::endl;
  *stream << "       -e    : use a numerically    (  bool)[" << std::setw(5) << std::right << sptk::ConvertBooleanToString(kDefaultNumericallyStableFlag)          << "]" << std::endl;  // NOLINT
  *stream << "               stable algorithm" << std::endl;
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       vectors                      (double)[stdin]" << std::endl;
  *stream << "  stdout:" << std::endl;
  *stream << "       statistics                   (double)" << std::endl;
  *stream << "  notice:" << std::endl;
  *stream << "       -d is valid only if o = 0, 2 or 7" << std::endl;
  *stream << "       -s can be specified multiple times" << std::endl;
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}